

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphElements.h
# Opt level: O2

void __thiscall
dg::vr::VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::SimpleVisit>::visit
          (DFSIt<dg::vr::VRCodeGraph::SimpleVisit> *this,VRLocation *loc)

{
  bool bVar1;
  
  while( true ) {
    bVar1 = SimpleVisit::wasVisited(&this->super_SimpleVisit,loc);
    if (bVar1) break;
    SimpleVisit::find(&this->super_SimpleVisit,loc);
  }
  return;
}

Assistant:

void visit(VRLocation *loc) {
            while (!Visit::wasVisited(loc))
                Visit::find(loc);
        }